

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_invocable.h
# Opt level: O1

void absl::lts_20250127::internal_any_invocable::
     RemoteInvoker<false,void,google::protobuf::compiler::cpp::FileGenerator::GenerateSource(google::protobuf::io::Printer*)::__0&,google::protobuf::io::Printer*>
               (TypeErasedState *state,ForwardedParameterType<google::protobuf::io::Printer_*> args)

{
  long *plVar1;
  
  plVar1 = (long *)(state->remote).target;
  google::protobuf::compiler::cpp::ExtensionGenerator::GenerateRegistration
            (*(ExtensionGenerator **)(*(long *)(*plVar1 + 0x300) + plVar1[1] * 8),args,
             *(InitPriority *)(plVar1 + 2));
  return;
}

Assistant:

ReturnType RemoteInvoker(
    TypeErasedState* const state,
    ForwardedParameterType<P>... args) noexcept(SigIsNoexcept) {
  using RawT = RemoveCVRef<QualTRef>;
  static_assert(!IsStoredLocally<RawT>::value,
                "Target object must be in remote storage in order to be "
                "invoked from it.");

  auto& f = *static_cast<RawT*>(state->remote.target);
  return (InvokeR<ReturnType>)(static_cast<QualTRef>(f),
                               static_cast<ForwardedParameterType<P>>(args)...);
}